

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O0

void __thiscall spdlog::details::periodic_worker::~periodic_worker(periodic_worker *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  thread *in_stack_fffffffffffffff0;
  
  bVar1 = std::thread::joinable(in_stack_fffffffffffffff0);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffff0,in_RDI);
    (in_RDI->super___mutex_base)._M_mutex.__size[0] = '\0';
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2837e6);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable
            ((condition_variable *)(in_RDI[1].super___mutex_base._M_mutex.__size + 0x10));
  std::thread::~thread((thread *)0x28381e);
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::~periodic_worker()
{
    if (worker_thread_.joinable())
    {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            active_ = false;
        }
        cv_.notify_one();
        worker_thread_.join();
    }
}